

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_f6208e::FreeDesktopTrashOperation::tryCreateInfoFile
          (FreeDesktopTrashOperation *this,QString *filePath,QSystemError *error)

{
  undefined1 *puVar1;
  Data *pDVar2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_88;
  QStringBuilder<QByteArray,_const_char_(&)[11]> local_68;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit((QByteArray *)&local_88,filePath);
  local_68.a.d.size = local_88.size;
  local_68.a.d.ptr = local_88.ptr;
  local_68.a.d.d = local_88.d;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char *)0x0;
  local_88.size = 0;
  local_68.b = (char (*) [11])0x51de59;
  QStringBuilder<QByteArray,_const_char_(&)[11]>::convertTo<QByteArray>
            ((QByteArray *)&local_48,&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  pcVar5 = local_48.ptr;
  if (local_48.ptr == (char *)0x0) {
    pcVar5 = &QByteArray::_empty;
  }
  iVar3 = qt_safe_openat(this->infoDirFd,pcVar5,0xc2,0x1b6);
  this->infoFileFd = iVar3;
  if (iVar3 < 0) {
    puVar4 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar4 | 0x100000000);
  }
  else {
    pDVar2 = (this->infoFilePath).d.d;
    pcVar5 = (this->infoFilePath).d.ptr;
    (this->infoFilePath).d.d = local_48.d;
    (this->infoFilePath).d.ptr = local_48.ptr;
    puVar1 = (undefined1 *)(this->infoFilePath).d.size;
    (this->infoFilePath).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar5;
    local_48.size = (qsizetype)puVar1;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return -1 < iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool tryCreateInfoFile(const QString &filePath, QSystemError &error)
    {
        QByteArray p = QFile::encodeName(filePath) + ".trashinfo";
        infoFileFd = qt_safe_openat(infoDirFd, p, QT_OPEN_RDWR | QT_OPEN_CREAT | QT_OPEN_EXCL, 0666);
        if (infoFileFd < 0) {
            error = QSystemError(errno, QSystemError::StandardLibraryError);
            return false;
        }
        infoFilePath = std::move(p);
        return true;
    }